

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.h
# Opt level: O1

void __thiscall namedlabels::~namedlabels(namedlabels *this)

{
  v_array<v_hashmap<substring,_unsigned_long>::hash_elem> *pvVar1;
  pointer psVar2;
  char *__ptr;
  hash_elem *phVar3;
  
  psVar2 = (this->id2name).super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->id2name).super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
      super__Vector_impl_data._M_finish != psVar2) {
    free(psVar2->begin);
  }
  pvVar1 = &(this->name2id).dat;
  for (phVar3 = (this->name2id).dat._begin; phVar3 != (this->name2id).dat.end_array;
      phVar3 = phVar3 + 1) {
    if ((phVar3->occupied == true) && (__ptr = (phVar3->key).begin, __ptr != (char *)0x0)) {
      free(__ptr);
    }
  }
  phVar3 = pvVar1->_begin;
  if (phVar3 != (hash_elem *)0x0) {
    free(phVar3);
  }
  pvVar1->_begin = (hash_elem *)0x0;
  (this->name2id).dat._end = (hash_elem *)0x0;
  (this->name2id).dat.end_array = (hash_elem *)0x0;
  psVar2 = (this->id2name).super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (psVar2 != (pointer)0x0) {
    operator_delete(psVar2);
    return;
  }
  return;
}

Assistant:

~namedlabels()
  {
    if (id2name.size() > 0)
      free(id2name[0].begin);
    name2id.iter(deleter);
    name2id.delete_v();
  }